

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

Stream * rw::wdgl::writeNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  if ((*(long *)((long)object + 0x98) != 0) && (**(int **)((long)object + 0x98) == 0xb)) {
    lVar1 = *(long *)((long)object + 0x98);
    Stream::writeU32(stream,*(uint32 *)(lVar1 + 4));
    Stream::write32(stream,*(void **)(lVar1 + 8),*(int *)(lVar1 + 4) * 0x18);
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)(lVar1 + 0x18),(ulong)*(uint *)(lVar1 + 0x10));
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32, void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_WDGL)
		return stream;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	stream->writeU32(header->numAttribs);
	stream->write32(header->attribs, header->numAttribs*sizeof(AttribDesc));
	ASSERTLITTLE;
	stream->write8(header->data, header->dataSize);
	return stream;
}